

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O1

void ncnn::transpose_pack_B_tile_int8(Mat *B,Mat *BT,int batch,int max_jj,int max_kk,int nT)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [32];
  undefined2 *puVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  undefined1 (*pauVar30) [64];
  int iVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  undefined1 (*pauVar35) [64];
  long lVar36;
  long lVar37;
  long lVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  long local_70;
  
  if (0 < batch) {
    iVar33 = max_jj * batch;
    lVar15 = (long)iVar33;
    lVar34 = (long)(iVar33 * 2);
    uVar27 = max_kk & 0xfffffff0;
    lVar29 = (long)max_jj;
    lVar12 = (long)(iVar33 * 0x10) * 2;
    lVar13 = (long)(iVar33 * 8) * 2;
    lVar14 = lVar34 * 2;
    local_70 = 0;
    auVar39 = vpmovsxbd_avx512f(_DAT_005f1b10);
    auVar40 = vpmovsxbd_avx512f(_DAT_005f1b20);
    uVar28 = 0;
    uVar32 = 0;
    do {
      pauVar35 = (undefined1 (*) [64])((long)BT->w * uVar32 * BT->elemsize + (long)BT->data);
      if (max_jj < 0x10) {
        uVar21 = 0;
      }
      else {
        lVar20 = (ulong)uVar28 * -2;
        lVar36 = (ulong)uVar28 << 2;
        uVar26 = 0;
        uVar16 = uVar28;
        do {
          lVar37 = uVar26 + (uint)((int)uVar32 * max_jj);
          iVar33 = (int)lVar37;
          uVar21 = (ulong)(uint)(iVar33 << 4);
          if (max_kk < 0x10) {
            pauVar30 = (undefined1 (*) [64])((long)B->data + uVar21 * 2);
            uVar19 = 0;
          }
          else {
            pauVar30 = (undefined1 (*) [64])((long)B->data + (ulong)(uVar16 & 0xfffffff) * 0x20);
            iVar31 = 0xf;
            do {
              auVar41 = vmovdqu64_avx512f(*pauVar30);
              auVar42 = vmovdqu64_avx512f(pauVar30[1]);
              auVar43 = vmovdqu64_avx512f(pauVar30[4]);
              auVar44 = vmovdqu64_avx512f(pauVar30[5]);
              auVar45 = vinserti64x4_avx512f(auVar41,*(undefined1 (*) [32])pauVar30[1],1);
              auVar41 = vshufi64x2_avx512f(auVar41,pauVar30[2],0xee);
              auVar46 = vinserti64x4_avx512f(auVar42,*(undefined1 (*) [32])(pauVar30[1] + 0x20),1);
              auVar42 = vshufi64x2_avx512f(auVar42,pauVar30[3],0xee);
              auVar47 = vinserti64x4_avx512f(auVar43,*(undefined1 (*) [32])pauVar30[3],1);
              auVar43 = vshufi64x2_avx512f(auVar43,pauVar30[6],0xee);
              auVar48 = vinserti64x4_avx512f(auVar44,*(undefined1 (*) [32])(pauVar30[3] + 0x20),1);
              auVar44 = vshufi64x2_avx512f(auVar44,pauVar30[7],0xee);
              auVar49 = vpunpckldq_avx512f(auVar45,auVar41);
              auVar41 = vpunpckhdq_avx512f(auVar45,auVar41);
              auVar45 = vpunpckldq_avx512f(auVar46,auVar42);
              auVar42 = vpunpckhdq_avx512f(auVar46,auVar42);
              auVar46 = vpunpckldq_avx512f(auVar47,auVar43);
              auVar43 = vpunpckhdq_avx512f(auVar47,auVar43);
              auVar47 = vpunpckldq_avx512f(auVar48,auVar44);
              auVar44 = vpunpckhdq_avx512f(auVar48,auVar44);
              auVar48 = vpunpcklqdq_avx512f(auVar49,auVar45);
              auVar45 = vpunpckhqdq_avx512f(auVar49,auVar45);
              auVar49 = vpunpcklqdq_avx512f(auVar41,auVar42);
              auVar41 = vpunpckhqdq_avx512f(auVar41,auVar42);
              auVar42 = vpunpcklqdq_avx512f(auVar46,auVar47);
              auVar46 = vpunpckhqdq_avx512f(auVar46,auVar47);
              auVar47 = vpunpcklqdq_avx512f(auVar43,auVar44);
              auVar43 = vpunpckhqdq_avx512f(auVar43,auVar44);
              auVar44 = vshufi64x2_avx512f(auVar48,auVar42,0x88);
              auVar50 = vshufi64x2_avx512f(auVar45,auVar46,0x88);
              auVar51 = vshufi64x2_avx512f(auVar49,auVar47,0x88);
              auVar52 = vshufi64x2_avx512f(auVar41,auVar43,0x88);
              auVar42 = vshufi64x2_avx512f(auVar48,auVar42,0xdd);
              auVar45 = vshufi64x2_avx512f(auVar45,auVar46,0xdd);
              auVar46 = vshufi64x2_avx512f(auVar49,auVar47,0xdd);
              auVar43 = vshufi64x2_avx512f(auVar41,auVar43,0xdd);
              auVar41 = vmovdqu64_avx512f(auVar44);
              *pauVar35 = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar50);
              pauVar35[1] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar51);
              pauVar35[2] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar52);
              pauVar35[3] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar42);
              pauVar35[4] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar45);
              pauVar35[5] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar46);
              pauVar35[6] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar43);
              pauVar35[7] = auVar41;
              pauVar35 = pauVar35 + 8;
              pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar12);
              iVar31 = iVar31 + 0x10;
              uVar19 = uVar27;
            } while (iVar31 < max_kk);
          }
          uVar25 = (ulong)(uint)(iVar33 * 8);
          if ((int)(uVar19 | 7) < max_kk) {
            pauVar30 = (undefined1 (*) [64])
                       ((long)pauVar30 +
                       (ulong)(uVar16 & 0x1fffffff) * 0x10 + (ulong)(uVar16 & 0xfffffff) * -0x20);
            uVar18 = uVar19;
            do {
              auVar41 = vmovdqu64_avx512f(*pauVar30);
              auVar42 = vmovdqu64_avx512f(pauVar30[1]);
              auVar43 = vmovdqu64_avx512f(pauVar30[2]);
              auVar44 = vmovdqu64_avx512f(pauVar30[3]);
              auVar45 = vshufi64x2_avx512f(auVar41,auVar42,0x88);
              auVar41 = vshufi64x2_avx512f(auVar41,auVar42,0xdd);
              auVar42 = vshufi64x2_avx512f(auVar43,auVar44,0x88);
              auVar43 = vshufi64x2_avx512f(auVar43,auVar44,0xdd);
              auVar44 = vmovdqa64_avx512f(auVar45);
              auVar44 = vpermt2d_avx512f(auVar44,auVar39,auVar41);
              auVar46 = vmovdqa64_avx512f(auVar42);
              auVar46 = vpermt2d_avx512f(auVar46,auVar39,auVar43);
              auVar47 = vshufi64x2_avx512f(auVar44,auVar46,0x88);
              auVar44 = vshufi64x2_avx512f(auVar44,auVar46,0xdd);
              auVar41 = vpermt2d_avx512f(auVar45,auVar40,auVar41);
              auVar42 = vpermt2d_avx512f(auVar42,auVar40,auVar43);
              auVar43 = vshufi64x2_avx512f(auVar41,auVar42,0x88);
              auVar42 = vshufi64x2_avx512f(auVar41,auVar42,0xdd);
              auVar41 = vmovdqu64_avx512f(auVar47);
              *pauVar35 = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar44);
              pauVar35[1] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar43);
              pauVar35[2] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar42);
              pauVar35[3] = auVar41;
              pauVar35 = pauVar35 + 4;
              uVar19 = uVar18 + 8;
              pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar13);
              iVar33 = uVar18 + 0xf;
              uVar18 = uVar19;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar30 = (undefined1 (*) [64])((long)pauVar30 + uVar25 * 2 + uVar21 * -2);
          }
          if ((int)(uVar19 | 1) < max_kk) {
            pauVar30 = (undefined1 (*) [64])
                       ((long)pauVar30 + lVar36 + (ulong)(uVar16 & 0x1fffffff) * -0x10);
            uVar18 = uVar19;
            do {
              auVar41 = vmovdqu64_avx512f(*pauVar30);
              auVar41 = vmovdqu64_avx512f(auVar41);
              *pauVar35 = auVar41;
              pauVar35 = pauVar35 + 1;
              uVar19 = uVar18 + 2;
              pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar14);
              iVar33 = uVar18 + 3;
              uVar18 = uVar19;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar30 = (undefined1 (*) [64])((long)pauVar30 + lVar37 * 4 + uVar25 * -2);
          }
          iVar33 = max_kk - uVar19;
          if (iVar33 != 0 && (int)uVar19 <= max_kk) {
            pauVar22 = (undefined1 (*) [32])(*pauVar30 + lVar20);
            do {
              *(undefined1 (*) [32])*pauVar35 = *pauVar22;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar15 * 2);
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar21 = uVar26 + 0x10;
          lVar37 = uVar26 + 0x1f;
          uVar16 = uVar16 + 0x10;
          lVar36 = lVar36 + 0x40;
          lVar20 = lVar20 + -0x20;
          uVar26 = uVar21;
        } while (lVar37 < lVar29);
      }
      if ((int)((uint)uVar21 | 7) < max_jj) {
        lVar20 = local_70 + (uVar21 & 0xffffffff);
        lVar38 = lVar20 * 0x20;
        lVar37 = lVar20 * -0x10;
        lVar36 = lVar20 * -0xc;
        lVar20 = lVar20 * -2;
        uVar26 = uVar21 & 0xffffffff;
        do {
          lVar17 = uVar32 * lVar29 + uVar26;
          if (max_kk < 0x10) {
            pauVar30 = (undefined1 (*) [64])((long)B->data + lVar17 * 0x20);
            uVar16 = 0;
          }
          else {
            pauVar30 = (undefined1 (*) [64])((long)B->data + lVar38);
            iVar33 = 0xf;
            do {
              auVar41 = vmovdqu64_avx512f(*pauVar30);
              auVar42 = vmovdqu64_avx512f(pauVar30[1]);
              auVar43 = vinserti64x4_avx512f(auVar41,*(undefined1 (*) [32])pauVar30[1],1);
              auVar41 = vshufi64x2_avx512f(auVar41,pauVar30[2],0xee);
              auVar44 = vinserti64x4_avx512f(auVar42,*(undefined1 (*) [32])(pauVar30[1] + 0x20),1);
              auVar42 = vshufi64x2_avx512f(auVar42,pauVar30[3],0xee);
              auVar45 = vpunpckldq_avx512f(auVar43,auVar41);
              auVar41 = vpunpckhdq_avx512f(auVar43,auVar41);
              auVar43 = vpunpckldq_avx512f(auVar44,auVar42);
              auVar42 = vpunpckhdq_avx512f(auVar44,auVar42);
              auVar44 = vpunpcklqdq_avx512f(auVar45,auVar43);
              auVar43 = vpunpckhqdq_avx512f(auVar45,auVar43);
              auVar45 = vpunpcklqdq_avx512f(auVar41,auVar42);
              auVar41 = vpunpckhqdq_avx512f(auVar41,auVar42);
              auVar42 = vshufi64x2_avx512f(auVar44,auVar43,0x88);
              auVar46 = vshufi64x2_avx512f(auVar45,auVar41,0x88);
              auVar43 = vshufi64x2_avx512f(auVar44,auVar43,0xdd);
              auVar44 = vshufi64x2_avx512f(auVar45,auVar41,0xdd);
              auVar41 = vmovdqu64_avx512f(auVar42);
              *pauVar35 = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar46);
              pauVar35[1] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar43);
              pauVar35[2] = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar44);
              pauVar35[3] = auVar41;
              pauVar35 = pauVar35 + 4;
              pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar12);
              iVar33 = iVar33 + 0x10;
              uVar16 = uVar27;
            } while (iVar33 < max_kk);
          }
          if ((int)(uVar16 | 7) < max_kk) {
            pauVar22 = (undefined1 (*) [32])(*pauVar30 + lVar37);
            uVar19 = uVar16;
            do {
              auVar9 = vperm2f128_avx(*pauVar22,pauVar22[2],0x20);
              auVar53 = vperm2f128_avx(*pauVar22,pauVar22[2],0x31);
              auVar10 = vperm2f128_avx(pauVar22[1],pauVar22[3],0x20);
              auVar11 = vperm2f128_avx(pauVar22[1],pauVar22[3],0x31);
              auVar7 = vunpcklps_avx(auVar9,auVar53);
              auVar9 = vunpckhps_avx(auVar9,auVar53);
              auVar8 = vunpcklps_avx(auVar10,auVar11);
              auVar53 = vunpckhps_avx(auVar10,auVar11);
              auVar10 = vunpcklpd_avx(auVar7,auVar8);
              auVar7 = vunpckhpd_avx(auVar7,auVar8);
              auVar8 = vunpcklpd_avx(auVar9,auVar53);
              auVar9 = vunpckhpd_avx(auVar9,auVar53);
              *(undefined1 (*) [32])*pauVar35 = auVar10;
              *(undefined1 (*) [32])(*pauVar35 + 0x20) = auVar7;
              *(undefined1 (*) [32])pauVar35[1] = auVar8;
              *(undefined1 (*) [32])(pauVar35[1] + 0x20) = auVar9;
              pauVar35 = pauVar35 + 2;
              uVar16 = uVar19 + 8;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar13);
              iVar33 = uVar19 + 0xf;
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar22 = (undefined1 (*) [32])((long)pauVar30 + lVar17 * -0x10);
          }
          if ((int)(uVar16 | 1) < max_kk) {
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar36);
            uVar19 = uVar16;
            do {
              *(undefined1 (*) [32])*pauVar35 = *pauVar22;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
              uVar16 = uVar19 + 2;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar14);
              iVar33 = uVar19 + 3;
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar22 = (undefined1 (*) [32])((long)pauVar22 + lVar17 * -0xc);
          }
          iVar33 = max_kk - uVar16;
          if (iVar33 != 0 && (int)uVar16 <= max_kk) {
            pauVar24 = (undefined1 (*) [16])(*pauVar22 + lVar20);
            do {
              *(undefined1 (*) [16])*pauVar35 = *pauVar24;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar15 * 2);
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar21 = uVar26 + 8;
          lVar17 = uVar26 + 0xf;
          lVar38 = lVar38 + 0x100;
          lVar37 = lVar37 + -0x80;
          lVar36 = lVar36 + -0x60;
          lVar20 = lVar20 + -0x10;
          uVar26 = uVar21;
        } while (lVar17 < lVar29);
      }
      if ((int)((uint)uVar21 | 3) < max_jj) {
        lVar20 = local_70 + (uVar21 & 0xffffffff);
        lVar36 = lVar20 * 0x20;
        lVar37 = lVar20 * -0x10;
        lVar38 = lVar20 * -0xc;
        lVar20 = lVar20 * -2 + 6;
        uVar26 = uVar21 & 0xffffffff;
        do {
          lVar17 = uVar32 * lVar29 + uVar26;
          if (max_kk < 0x10) {
            pauVar30 = (undefined1 (*) [64])((long)B->data + lVar17 * 0x20);
            uVar16 = 0;
          }
          else {
            pauVar30 = (undefined1 (*) [64])((long)B->data + lVar36);
            iVar33 = 0xf;
            do {
              auVar41 = vmovdqu64_avx512f(*pauVar30);
              auVar42 = vinserti64x4_avx512f(auVar41,*(undefined1 (*) [32])(*pauVar30 + 0x20),1);
              auVar41 = vshufi64x2_avx512f(auVar41,pauVar30[1],0xee);
              auVar43 = vmovdqa64_avx512f(auVar42);
              auVar43 = vpermt2d_avx512f(auVar43,auVar39,auVar41);
              auVar41 = vpermt2d_avx512f(auVar42,auVar40,auVar41);
              auVar42 = vinserti64x4_avx512f(auVar43,auVar41._0_32_,1);
              auVar41 = vshufi64x2_avx512f(auVar43,auVar41,0xee);
              auVar43 = vpunpcklqdq_avx512f(auVar42,auVar41);
              auVar42 = vpunpckhqdq_avx512f(auVar42,auVar41);
              auVar41 = vmovdqu64_avx512f(auVar43);
              *pauVar35 = auVar41;
              auVar41 = vmovdqu64_avx512f(auVar42);
              pauVar35[1] = auVar41;
              pauVar35 = pauVar35 + 2;
              pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar12);
              iVar33 = iVar33 + 0x10;
              uVar16 = uVar27;
            } while (iVar33 < max_kk);
          }
          if ((int)(uVar16 | 7) < max_kk) {
            pauVar24 = (undefined1 (*) [16])(*pauVar30 + lVar37);
            uVar19 = uVar16;
            do {
              auVar5 = vunpcklps_avx(*pauVar24,pauVar24[1]);
              auVar2 = vunpckhps_avx(*pauVar24,pauVar24[1]);
              auVar6 = vunpcklps_avx(pauVar24[2],pauVar24[3]);
              auVar3 = vunpckhps_avx(pauVar24[2],pauVar24[3]);
              auVar4 = vunpcklpd_avx(auVar5,auVar6);
              auVar5 = vunpckhpd_avx(auVar5,auVar6);
              auVar6 = vunpcklpd_avx(auVar2,auVar3);
              auVar2 = vunpckhpd_avx(auVar2,auVar3);
              *(undefined1 (*) [16])*pauVar35 = auVar4;
              *(undefined1 (*) [16])(*pauVar35 + 0x10) = auVar5;
              *(undefined1 (*) [16])(*pauVar35 + 0x20) = auVar6;
              *(undefined1 (*) [16])(*pauVar35 + 0x30) = auVar2;
              pauVar35 = pauVar35 + 1;
              uVar16 = uVar19 + 8;
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar13);
              iVar33 = uVar19 + 0xf;
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar24 = (undefined1 (*) [16])((long)pauVar30 + lVar17 * -0x10);
          }
          if ((int)(uVar16 | 1) < max_kk) {
            pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar38);
            uVar19 = uVar16;
            do {
              *(undefined1 (*) [16])*pauVar35 = *pauVar24;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
              uVar16 = uVar19 + 2;
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar14);
              iVar33 = uVar19 + 3;
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar24 = (undefined1 (*) [16])((long)pauVar24 + lVar17 * -0xc);
          }
          iVar33 = max_kk - uVar16;
          if (iVar33 != 0 && (int)uVar16 <= max_kk) {
            puVar23 = (undefined2 *)(*pauVar24 + lVar20);
            do {
              *(undefined2 *)*pauVar35 = puVar23[-3];
              *(undefined2 *)(*pauVar35 + 2) = puVar23[-2];
              *(undefined2 *)(*pauVar35 + 4) = puVar23[-1];
              *(undefined2 *)(*pauVar35 + 6) = *puVar23;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 8);
              puVar23 = puVar23 + lVar15;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar21 = uVar26 + 4;
          lVar17 = uVar26 + 7;
          lVar36 = lVar36 + 0x80;
          lVar37 = lVar37 + -0x40;
          lVar38 = lVar38 + -0x30;
          lVar20 = lVar20 + -8;
          uVar26 = uVar21;
        } while (lVar17 < lVar29);
      }
      uVar16 = (uint)uVar21;
      if ((int)(uVar16 | 1) < max_jj) {
        lVar20 = local_70 + (int)uVar16;
        lVar36 = lVar20 * 0x20;
        lVar37 = lVar20 * -0x10;
        lVar38 = lVar20 * -0xc;
        lVar20 = lVar20 * -2 + 2;
        uVar26 = (long)(int)uVar16;
        do {
          lVar17 = uVar26 + uVar32 * lVar29;
          if (max_kk < 0x10) {
            pauVar22 = (undefined1 (*) [32])((long)B->data + lVar17 * 0x20);
            uVar16 = 0;
          }
          else {
            pauVar22 = (undefined1 (*) [32])((long)B->data + lVar36);
            iVar33 = 0xf;
            do {
              auVar9 = vpunpckldq_avx2(*pauVar22,pauVar22[1]);
              auVar7 = vpunpckhdq_avx2(*pauVar22,pauVar22[1]);
              auVar53._0_16_ = ZEXT116(0) * auVar7._0_16_ + ZEXT116(1) * auVar9._0_16_;
              auVar53._16_16_ = ZEXT116(0) * auVar9._16_16_ + ZEXT116(1) * auVar7._0_16_;
              auVar7 = vperm2i128_avx2(auVar9,auVar7,0x31);
              *(undefined1 (*) [32])*pauVar35 = auVar53;
              *(undefined1 (*) [32])(*pauVar35 + 0x20) = auVar7;
              pauVar35 = pauVar35 + 1;
              iVar33 = iVar33 + 0x10;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar12);
              uVar16 = uVar27;
            } while (iVar33 < max_kk);
          }
          if ((int)(uVar16 | 7) < max_kk) {
            pauVar24 = (undefined1 (*) [16])(*pauVar22 + lVar37);
            uVar19 = uVar16;
            do {
              auVar2 = vunpcklps_avx(*pauVar24,pauVar24[1]);
              auVar5 = vunpckhps_avx(*pauVar24,pauVar24[1]);
              *(undefined1 (*) [16])*pauVar35 = auVar2;
              *(undefined1 (*) [16])(*pauVar35 + 0x10) = auVar5;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
              uVar16 = uVar19 + 8;
              iVar33 = uVar19 + 0xf;
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar13);
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar24 = (undefined1 (*) [16])((long)pauVar22 + lVar17 * -0x10);
          }
          if ((int)(uVar16 | 1) < max_kk) {
            puVar23 = (undefined2 *)(*pauVar24 + lVar38);
            uVar19 = uVar16;
            do {
              *(undefined2 *)*pauVar35 = *puVar23;
              *(undefined2 *)(*pauVar35 + 2) = puVar23[1];
              *(undefined2 *)(*pauVar35 + 4) = puVar23[2];
              *(undefined2 *)(*pauVar35 + 6) = puVar23[3];
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 8);
              uVar16 = uVar19 + 2;
              iVar33 = uVar19 + 3;
              puVar23 = puVar23 + lVar34;
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            puVar23 = (undefined2 *)((long)pauVar24 + lVar17 * -0xc);
          }
          iVar33 = max_kk - uVar16;
          if (iVar33 != 0 && (int)uVar16 <= max_kk) {
            puVar23 = (undefined2 *)((long)puVar23 + lVar20);
            do {
              *(undefined2 *)*pauVar35 = puVar23[-1];
              *(undefined2 *)(*pauVar35 + 2) = *puVar23;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 4);
              puVar23 = puVar23 + lVar15;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar21 = uVar26 + 2;
          lVar17 = uVar26 + 3;
          lVar36 = lVar36 + 0x40;
          lVar37 = lVar37 + -0x20;
          lVar38 = lVar38 + -0x18;
          lVar20 = lVar20 + -4;
          uVar26 = uVar21;
        } while (lVar17 < lVar29);
      }
      if ((int)uVar21 < max_jj) {
        lVar36 = (long)(int)uVar21;
        lVar20 = local_70 + lVar36;
        lVar17 = lVar20 * 0x20;
        lVar38 = lVar20 * -0x10;
        lVar37 = lVar20 * -0xc;
        lVar20 = lVar20 * -2;
        do {
          lVar1 = lVar36 + uVar32 * lVar29;
          if (max_kk < 0x10) {
            pauVar22 = (undefined1 (*) [32])((long)B->data + lVar1 * 0x20);
            uVar16 = 0;
          }
          else {
            pauVar22 = (undefined1 (*) [32])((long)B->data + lVar17);
            iVar33 = 0xf;
            do {
              *(undefined1 (*) [32])*pauVar35 = *pauVar22;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
              iVar33 = iVar33 + 0x10;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar12);
              uVar16 = uVar27;
            } while (iVar33 < max_kk);
          }
          if ((int)(uVar16 | 7) < max_kk) {
            pauVar24 = (undefined1 (*) [16])(*pauVar22 + lVar38);
            uVar19 = uVar16;
            do {
              *(undefined1 (*) [16])*pauVar35 = *pauVar24;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
              uVar16 = uVar19 + 8;
              iVar33 = uVar19 + 0xf;
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar13);
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            pauVar24 = (undefined1 (*) [16])((long)pauVar22 + lVar1 * -0x10);
          }
          if ((int)(uVar16 | 1) < max_kk) {
            puVar23 = (undefined2 *)(*pauVar24 + lVar37);
            uVar19 = uVar16;
            do {
              *(undefined2 *)*pauVar35 = *puVar23;
              *(undefined2 *)(*pauVar35 + 2) = puVar23[1];
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 4);
              uVar16 = uVar19 + 2;
              iVar33 = uVar19 + 3;
              puVar23 = puVar23 + lVar34;
              uVar19 = uVar16;
            } while (iVar33 < max_kk);
          }
          else {
            puVar23 = (undefined2 *)((long)pauVar24 + lVar1 * -0xc);
          }
          iVar33 = max_kk - uVar16;
          if (iVar33 != 0 && (int)uVar16 <= max_kk) {
            puVar23 = (undefined2 *)((long)puVar23 + lVar20);
            do {
              *(undefined2 *)*pauVar35 = *puVar23;
              pauVar35 = (undefined1 (*) [64])(*pauVar35 + 2);
              puVar23 = puVar23 + lVar15;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          lVar36 = lVar36 + 1;
          lVar17 = lVar17 + 0x20;
          lVar38 = lVar38 + -0x10;
          lVar37 = lVar37 + -0xc;
          lVar20 = lVar20 + -2;
        } while (lVar36 != lVar29);
      }
      uVar32 = uVar32 + 1;
      uVar28 = uVar28 + max_jj;
      local_70 = local_70 + lVar29;
    } while (uVar32 != (uint)batch);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile_int8(const Mat& B, Mat& BT, int batch, int max_jj, int max_kk, int nT)
{
    #pragma omp parallel for num_threads(nT)
    for (int b = 0; b < batch; b++)
    {
        short* pp = BT.row<short>(b);

        int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            const short* p0 = B;

            int kk = 0;
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _r4 = _mm512_loadu_si512((const __m512i*)(p0 + 128));
                __m512i _r5 = _mm512_loadu_si512((const __m512i*)(p0 + 160));
                __m512i _r6 = _mm512_loadu_si512((const __m512i*)(p0 + 192));
                __m512i _r7 = _mm512_loadu_si512((const __m512i*)(p0 + 224));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp4 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp5 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp6 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp7 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _r4 = _mm512_unpacklo_epi32(_tmp4, _tmp5);
                _r5 = _mm512_unpackhi_epi32(_tmp4, _tmp5);
                _r6 = _mm512_unpacklo_epi32(_tmp6, _tmp7);
                _r7 = _mm512_unpackhi_epi32(_tmp6, _tmp7);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _tmp4 = _mm512_unpacklo_epi64(_r4, _r6);
                _tmp5 = _mm512_unpackhi_epi64(_r4, _r6);
                _tmp6 = _mm512_unpacklo_epi64(_r5, _r7);
                _tmp7 = _mm512_unpackhi_epi64(_r5, _r7);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                _r4 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(3, 1, 3, 1));
                _r5 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                _r6 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(3, 1, 3, 1));
                _r7 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                _mm512_storeu_si512((__m512i*)(pp + 128), _r4);
                _mm512_storeu_si512((__m512i*)(pp + 160), _r5);
                _mm512_storeu_si512((__m512i*)(pp + 192), _r6);
                _mm512_storeu_si512((__m512i*)(pp + 224), _r7);
                p0 += max_jj * batch * 16;
                pp += 256;
            }
            p0 -= (b * max_jj + jj) * 16;
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 1, 3, 1));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(3, 1, 3, 1));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp2 = _mm512_permutex_epi64(_r2, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp3 = _mm512_permutex_epi64(_r3, _MM_SHUFFLE(3, 1, 2, 0));
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(3, 1, 3, 1));
                _r2 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 8;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m256i _r0 = _mm256_loadu_si256((const __m256i*)p0);
                _mm256_store_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                _r3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 16;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                __m256 _r1 = _mm256_loadu_ps((const float*)(p0 + 16));
                __m256 _r2 = _mm256_loadu_ps((const float*)(p0 + 32));
                __m256 _r3 = _mm256_loadu_ps((const float*)(p0 + 48));
                __m256 _tmp0 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp1 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 3, 0, 1));
                __m256 _tmp2 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp3 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 3, 0, 1));
                _r0 = _mm256_unpacklo_ps(_tmp0, _tmp1);
                _r1 = _mm256_unpackhi_ps(_tmp0, _tmp1);
                _r2 = _mm256_unpacklo_ps(_tmp2, _tmp3);
                _r3 = _mm256_unpackhi_ps(_tmp2, _tmp3);
                _tmp0 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp1 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp2 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _tmp3 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _mm256_storeu_ps((float*)pp, _tmp0);
                _mm256_storeu_ps((float*)(pp + 16), _tmp1);
                _mm256_storeu_ps((float*)(pp + 32), _tmp2);
                _mm256_storeu_ps((float*)(pp + 48), _tmp3);
#else
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                __m128i _r4 = _mm_load_si128((const __m128i*)(p0 + 8 * 4));
                __m128i _r5 = _mm_load_si128((const __m128i*)(p0 + 8 * 5));
                __m128i _r6 = _mm_load_si128((const __m128i*)(p0 + 8 * 6));
                __m128i _r7 = _mm_load_si128((const __m128i*)(p0 + 8 * 7));
                transpose4x8_epi32(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
                _mm_store_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_store_si128((__m128i*)(pp + 8 * 3), _r3);
                _mm_store_si128((__m128i*)(pp + 8 * 4), _r4);
                _mm_store_si128((__m128i*)(pp + 8 * 5), _r5);
                _mm_store_si128((__m128i*)(pp + 8 * 6), _r6);
                _mm_store_si128((__m128i*)(pp + 8 * 7), _r7);
#endif // __AVX__
                p0 += max_jj * batch * 8;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                _mm256_storeu_ps((float*)pp, _r0);
#else
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)(p0 + 8));
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
#endif // __AVX__
                p0 += max_jj * batch * 2;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_store_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 8;
            }
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _r1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                p0 += max_jj * batch * 16;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                transpose4x4_epi32(_r0, _r1, _r2, _r3);
                _mm_storeu_si128((__m128i*)pp, _r0);
                _mm_storeu_si128((__m128i*)(pp + 8), _r1);
                _mm_storeu_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_storeu_si128((__m128i*)(pp + 8 * 3), _r3);
                p0 += max_jj * batch * 8;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                __m256i _r1 = _mm256_load_si256((const __m256i*)(p0 + 16));
                transpose8x2_epi32(_r0, _r1);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                _mm256_storeu_si256((__m256i*)(pp + 16), _r1);
                p0 += max_jj * batch * 16;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _tmp0 = _mm_unpacklo_epi32(_r0, _r1);
                __m128i _tmp1 = _mm_unpackhi_epi32(_r0, _r1);
                _mm_storeu_si128((__m128i*)pp, _tmp0);
                _mm_storeu_si128((__m128i*)(pp + 8), _tmp1);
                p0 += max_jj * batch * 8;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch * 2;
                pp += 4;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch;
                pp += 2;
            }
        }
        for (; jj < max_jj; jj++)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch * 16;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 8;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch * 2;
                pp += 2;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += max_jj * batch;
                pp += 1;
            }
        }
    }
}